

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

uint32_t predict_sup_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  vector<float,_std::allocator<float>_> local_40;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_40,&data->cumulative_costs);
  if ((long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar1 = 0;
  }
  else {
    fVar4 = 3.4028235e+38;
    uVar2 = 0;
    uVar3 = 0;
    do {
      if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar2] < fVar4) {
        uVar3 = uVar2 & 0xffffffff;
        fVar4 = local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar2];
      }
      uVar1 = (uint32_t)uVar3;
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) <
             (ulong)((long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  if (local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar1 = predict_sublearner_adf(data,base,ec,uVar1);
  return uVar1;
}

Assistant:

uint32_t predict_sup_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);
	return predict_sublearner_adf(data, base, ec, argmin);
}